

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O0

void __thiscall
HdmiCecAnalyzerResults::GenerateTransactionTabularText
          (HdmiCecAnalyzerResults *this,U64 param_1,DisplayBase param_2)

{
  allocator local_41;
  string local_40 [36];
  DisplayBase local_1c;
  U64 UStack_18;
  DisplayBase param_2_local;
  U64 param_1_local;
  HdmiCecAnalyzerResults *this_local;
  
  local_1c = param_2;
  UStack_18 = param_1;
  param_1_local = (U64)this;
  AnalyzerResults::ClearResultStrings();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Not supported",&local_41);
  AddResult(this,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenerateTransactionTabularText( U64 /*transaction_id*/, DisplayBase /*display_base*/ )
{
    ClearResultStrings();
    AddResult( "Not supported" );
}